

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_unusedcode.c
# Opt level: O2

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)

{
  BasicBlock *pBVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  nodeId_t nVar6;
  Proc *proc;
  GraphNode *n;
  GraphNodeList *pGVar7;
  void *ptr;
  long lVar8;
  ulong new_n;
  uint32_t i;
  ulong uVar9;
  PtrListIterator prociter__;
  
  raviX_ptrlist_forward_iterator(&prociter__,(PtrList *)linearizer->all_procs);
  while( true ) {
    proc = (Proc *)raviX_ptrlist_iter_next(&prociter__);
    if (proc == (Proc *)0x0) break;
    if (proc->cfg == (Graph *)0x0) {
      iVar4 = raviX_construct_cfg(proc);
      if (iVar4 != 0) break;
    }
    bVar2 = true;
    while (bVar2) {
      bVar2 = false;
      for (lVar8 = 0; lVar8 < (int)proc->node_count; lVar8 = lVar8 + 1) {
        pBVar1 = proc->nodes[lVar8];
        if (1 < pBVar1->index) {
          n = raviX_graph_node(proc->cfg,pBVar1->index);
          pGVar7 = raviX_predecessors(n);
          uVar5 = raviX_node_list_size(pGVar7);
          bVar3 = 0;
          if (uVar5 == 0) {
            pGVar7 = raviX_successors(n);
            uVar5 = raviX_node_list_size(pGVar7);
            if (uVar5 != 0) {
              new_n = (ulong)uVar5;
              ptr = raviX_realloc_array((void *)0x0,4,0,new_n);
              for (uVar9 = 0; new_n != uVar9; uVar9 = uVar9 + 1) {
                nVar6 = raviX_node_list_at(pGVar7,(uint32_t)uVar9);
                *(nodeId_t *)((long)ptr + uVar9 * 4) = nVar6;
              }
              for (uVar9 = 0; new_n != uVar9; uVar9 = uVar9 + 1) {
                raviX_delete_edge(proc->cfg,pBVar1->index,*(nodeId_t *)((long)ptr + uVar9 * 4));
              }
              raviX_free(ptr);
              uVar5 = raviX_node_list_size(pGVar7);
              if (uVar5 != 0) {
                __assert_fail("raviX_node_list_size(successors) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/opt_unusedcode.c"
                              ,0x40,"int process_block(LinearizerState *, Proc *, BasicBlock *)");
              }
              raviX_ptrlist_remove_all((PtrList **)&pBVar1->insns);
              bVar3 = 1;
            }
          }
          bVar2 = (bool)(bVar2 | bVar3);
        }
      }
    }
  }
  return (int)(proc != (Proc *)0x0);
}

Assistant:

int raviX_remove_unreachable_blocks(LinearizerState *linearizer)
{
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
		{
			if (process_proc(linearizer, proc) != 0)
				return 1;
		}
	END_FOR_EACH_PTR(proc)
	return 0;
}